

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O2

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  pattern_formatter *this;
  allocator local_99;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_98;
  string local_90;
  string local_70;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_50;
  
  this = (pattern_formatter *)operator_new(0xe0);
  std::__cxx11::string::string((string *)&local_70,(string *)pattern);
  std::__cxx11::string::string((string *)&local_90,"\n",&local_99);
  local_50._M_buckets = &local_50._M_single_bucket;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._4_4_ = 0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  pattern_formatter::pattern_formatter(this,&local_70,time_type,&local_90,(custom_flags *)&local_50)
  ;
  local_98._M_head_impl = (formatter *)this;
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_98)
  ;
  if ((pattern_formatter *)local_98._M_head_impl != (pattern_formatter *)0x0) {
    (*((formatter *)&(local_98._M_head_impl)->_vptr_formatter)->_vptr_formatter[1])();
  }
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type)
{
    set_formatter(std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}